

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O3

int SUNHashMap_GetValue(SUNHashMap map,char *key,void **value)

{
  uint uVar1;
  SUNHashMapKeyValue *ppSVar2;
  SUNHashMapKeyValue pSVar3;
  SUNHashMapKeyValue pSVar4;
  int iVar5;
  char *pcVar6;
  char cVar7;
  ulong uVar8;
  int iVar9;
  
  iVar9 = -1;
  if (value != (void **)0x0 && (key != (char *)0x0 && map != (SUNHashMap)0x0)) {
    uVar8 = 0x100000001b3;
    cVar7 = *key;
    if (cVar7 == '\0') {
      uVar8 = 0x100000001b3;
    }
    else {
      pcVar6 = key + 1;
      do {
        uVar8 = ((long)cVar7 ^ uVar8) * -0x340d631b7bdddcdb;
        cVar7 = *pcVar6;
        pcVar6 = pcVar6 + 1;
      } while (cVar7 != '\0');
    }
    uVar1 = map->max_size;
    ppSVar2 = map->buckets;
    iVar9 = (int)(uVar8 % (ulong)(long)(int)uVar1);
    pSVar3 = ppSVar2[iVar9];
    if (pSVar3 == (SUNHashMapKeyValue)0x0) {
      iVar9 = -2;
    }
    else {
      iVar5 = strcmp(pSVar3->key,key);
      if (iVar5 != 0) {
        iVar9 = iVar9 + 1;
        uVar8 = (ulong)uVar1;
        if (iVar9 < (int)uVar1) {
          uVar8 = (ulong)iVar9;
          do {
            pSVar4 = ppSVar2[uVar8];
            if (((pSVar4 != (SUNHashMapKeyValue)0x0) &&
                (iVar9 = strcmp(pSVar4->key,key), uVar8 != 0xffffffffffffffff)) && (iVar9 == 0))
            goto LAB_001077de;
            uVar8 = uVar8 + 1;
          } while ((long)uVar8 < (long)(int)uVar1);
          uVar8 = (ulong)uVar1;
        }
LAB_001077de:
        if ((int)(uint)uVar8 < 0) {
          return -1;
        }
        if ((uint)uVar8 == uVar1) {
          return -2;
        }
      }
      *value = pSVar3->value;
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int SUNHashMap_GetValue(SUNHashMap map, const char* key, void** value)
{
  int idx;
  int retval;

  if (map == NULL || key == NULL || value == NULL) { return (-1); }

  /* We want the index to be in (0, map->max_size) */
  idx = (int)(fnv1a_hash(key) % map->max_size);

  /* Check if the key exists */
  if (map->buckets[idx] == NULL) { return (-2); }

  /* Check to see if this is a collision */
  if (strcmp(map->buckets[idx]->key, key))
  {
    /* Keys did not match, so we have a collision and need to probe */
    retval = SUNHashMap_Iterate(map, idx + 1, sunHashMapLinearProbeGet, key);
    if (retval < 0) { return (-1); /* error occurred */ }
    if (retval == map->max_size) { return (-2); /* not found */ }
  }

  /* Return a reference to the value only */
  *value = map->buckets[idx]->value;

  return (0);
}